

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

string * __thiscall
GdlRule::EngineCodeDebugString_abi_cxx11_(string *__return_storage_ptr__,GdlRule *this,int op)

{
  char *pcVar1;
  string local_30;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "Nop";
    break;
  case 1:
    pcVar1 = "PushByte";
    break;
  case 2:
    pcVar1 = "PushByteU";
    break;
  case 3:
    pcVar1 = "PushShort";
    break;
  case 4:
    pcVar1 = "PushShortU";
    break;
  case 5:
    pcVar1 = "PushLong";
    break;
  case 6:
    pcVar1 = "Add";
    break;
  case 7:
    pcVar1 = "Sub";
    break;
  case 8:
    pcVar1 = "Mul";
    break;
  case 9:
    pcVar1 = "Div";
    break;
  case 10:
    pcVar1 = "Min";
    break;
  case 0xb:
    pcVar1 = "Max";
    break;
  case 0xc:
    pcVar1 = "Neg";
    break;
  case 0xd:
    pcVar1 = "Trunc8";
    break;
  case 0xe:
    pcVar1 = "Trunc16";
    break;
  case 0xf:
    pcVar1 = "Cond";
    break;
  case 0x10:
    pcVar1 = "And";
    break;
  case 0x11:
    pcVar1 = "Or";
    break;
  case 0x12:
    pcVar1 = "Not";
    break;
  case 0x13:
    pcVar1 = "Equal";
    break;
  case 0x14:
    pcVar1 = "NotEq";
    break;
  case 0x15:
    pcVar1 = "Less";
    break;
  case 0x16:
    pcVar1 = "Gtr";
    break;
  case 0x17:
    pcVar1 = "LessEq";
    break;
  case 0x18:
    pcVar1 = "GtrEq";
    break;
  case 0x19:
    pcVar1 = "Next";
    break;
  case 0x1a:
    pcVar1 = "NextN";
    break;
  case 0x1b:
    pcVar1 = "CopyNext";
    break;
  case 0x1c:
    pcVar1 = "PutGlyph(V1&2)";
    break;
  case 0x1d:
    pcVar1 = "PutSubs(V1&2)";
    break;
  case 0x1e:
    pcVar1 = "PutCopy";
    break;
  case 0x1f:
    pcVar1 = "Insert";
    break;
  case 0x20:
    pcVar1 = "Delete";
    break;
  case 0x21:
    pcVar1 = "Assoc";
    break;
  case 0x22:
    pcVar1 = "CntxtItem";
    break;
  case 0x23:
    pcVar1 = "AttrSet";
    break;
  case 0x24:
    pcVar1 = "AttrAdd";
    break;
  case 0x25:
    pcVar1 = "AttrSub";
    break;
  case 0x26:
    pcVar1 = "AttrSetSlot";
    break;
  case 0x27:
    pcVar1 = "IAttrSetSlot";
    break;
  case 0x28:
    pcVar1 = "PushSlotAttr";
    break;
  case 0x29:
    pcVar1 = "PushGlyphAttr(V1&2)";
    break;
  case 0x2a:
    pcVar1 = "PushGlyphMetric";
    break;
  case 0x2b:
    pcVar1 = "PushFeat";
    break;
  case 0x2c:
    pcVar1 = "PushAttToGlyphAttr(V1&2)";
    break;
  case 0x2d:
    pcVar1 = "PushAttToGlyphMetric";
    break;
  case 0x2e:
    pcVar1 = "PushISlotAttr";
    break;
  case 0x2f:
    pcVar1 = "PushIGlyphAttr";
    break;
  case 0x30:
    pcVar1 = "PopRet";
    break;
  case 0x31:
    pcVar1 = "RetZero";
    break;
  case 0x32:
    pcVar1 = "RetTrue";
    break;
  case 0x33:
    pcVar1 = "IAttrSet";
    break;
  case 0x34:
    pcVar1 = "IAttrAdd";
    break;
  case 0x35:
    pcVar1 = "IAttrSub";
    break;
  case 0x36:
    pcVar1 = "PushProcState";
    break;
  case 0x37:
    pcVar1 = "PushVersion";
    break;
  case 0x38:
    pcVar1 = "PutSubs";
    break;
  case 0x39:
    pcVar1 = "PutSubs2";
    break;
  case 0x3a:
    pcVar1 = "PutSubs3";
    break;
  case 0x3b:
    pcVar1 = "PutGlyph";
    break;
  case 0x3c:
    pcVar1 = "PushGlyphAttr";
    break;
  case 0x3d:
    pcVar1 = "PushAttToGlyphAttr";
    break;
  case 0x3e:
    pcVar1 = "BitAnd";
    break;
  case 0x3f:
    pcVar1 = "BitOr";
    break;
  case 0x40:
    pcVar1 = "BitNot";
    break;
  case 0x41:
    pcVar1 = "SetBits";
    break;
  case 0x42:
    pcVar1 = "FeatSet";
    break;
  default:
    std::__cxx11::to_string(&local_30,(int)this);
    std::operator+(__return_storage_ptr__,"bad-engine-op-",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GdlRule::EngineCodeDebugString(int op)
{
	switch (op)
	{
	case kopNop:					return "Nop";
	case kopPushByte:				return "PushByte";
	case kopPushByteU:				return "PushByteU";
	case kopPushShort:				return "PushShort";
	case kopPushShortU:				return "PushShortU";
	case kopPushLong:				return "PushLong";
	case kopAdd:					return "Add";
	case kopSub:					return "Sub";
	case kopMul:					return "Mul";
	case kopDiv:					return "Div";
	case kopMin:					return "Min";
	case kopMax:					return "Max";
	case kopNeg:					return "Neg";
	case kopTrunc8:					return "Trunc8";
	case kopTrunc16:				return "Trunc16";
	case kopCond:					return "Cond";
	case kopAnd:					return "And";
	case kopOr:						return "Or";
	case kopNot:					return "Not";
	case kopBitAnd:					return "BitAnd";
	case kopBitOr:					return "BitOr";
	case kopBitNot:					return "BitNot";
	case kopEqual:					return "Equal";
	case kopNotEq:					return "NotEq";
	case kopLess:					return "Less";
	case kopGtr:					return "Gtr";
	case kopLessEq:					return "LessEq";
	case kopGtrEq:					return "GtrEq";
	case kopNext:					return "Next";
	case kopNextN:					return "NextN";
	case kopCopyNext:				return "CopyNext";
	case kopPutGlyph:				return "PutGlyph";
	case kopPutGlyphV1_2:			return "PutGlyph(V1&2)";
	case kopPutSubsV1_2:			return "PutSubs(V1&2)";
	case kopPutSubs:				return "PutSubs";
	case kopPutSubs2:				return "PutSubs2";
	case kopPutSubs3:				return "PutSubs3";
	case kopPutCopy:				return "PutCopy";
	case kopInsert:					return "Insert";
	case kopDelete:					return "Delete";
	case kopAssoc:					return "Assoc";
	case kopCntxtItem:				return "CntxtItem";
	case kopAttrSet:				return "AttrSet";
	case kopAttrAdd:				return "AttrAdd";
	case kopAttrSub:				return "AttrSub";
//	case kopAttrBitAnd:				return "AttrBitAnd";
//	case kopAttrBitOr:				return "AttrBitOr";
	case kopAttrSetSlot:			return "AttrSetSlot";
	case kopIAttrSetSlot:			return "IAttrSetSlot";
	case kopPushSlotAttr:			return "PushSlotAttr";
	case kopPushISlotAttr:			return "PushISlotAttr";
	case kopPushGlyphAttr:			return "PushGlyphAttr";
	case kopPushGlyphAttrV1_2:		return "PushGlyphAttr(V1&2)";
	case kopPushGlyphMetric:		return "PushGlyphMetric";
	case kopPushFeat:				return "PushFeat";
	case kopPushAttToGlyphAttr:		return "PushAttToGlyphAttr";
	case kopPushAttToGAttrV1_2:		return "PushAttToGlyphAttr(V1&2)";
	case kopPushAttToGlyphMetric:	return "PushAttToGlyphMetric";
	case kopPushIGlyphAttr:			return "PushIGlyphAttr";
	case kopPushVersion:			return "PushVersion";
	case kopPopRet:					return "PopRet";
	case kopRetZero:				return "RetZero";
	case kopRetTrue:				return "RetTrue";
	case kopIAttrSet:				return "IAttrSet";
	case kopIAttrAdd:				return "IAttrAdd";
	case kopIAttrSub:				return "IAttrSub";
//	case kopIAttrBitAnd:			return "IAttrBitAnd";
//	case kopIAttrBitOr:				return "IAttrBitOr";
	case kopPushProcState:			return "PushProcState";
	case kopSetBits:				return "SetBits";
	case kopFeatSet:				return "FeatSet";
	default:
		Assert(false);
		return "bad-engine-op-" + std::to_string(op);
	}
}